

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt> *
__thiscall
pybind11::
class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>::
def_property_readonly<std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>const&(kratos::EventTracingStmt::*)()const>
          (class_<kratos::EventTracingStmt,std::shared_ptr<kratos::EventTracingStmt>,kratos::AuxiliaryStmt>
           *this,char *name,offset_in_Var_to_subr *fget)

{
  class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
  *pcVar1;
  cpp_function local_30;
  return_value_policy local_21;
  
  cpp_function::
  cpp_function<std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>const&,kratos::EventTracingStmt>
            (&local_30,*fget);
  local_21 = reference_internal;
  pcVar1 = class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
           ::def_property_readonly<pybind11::return_value_policy>
                     ((class_<kratos::EventTracingStmt,_std::shared_ptr<kratos::EventTracingStmt>,_kratos::AuxiliaryStmt>
                       *)this,name,&local_30,&local_21);
  object::~object((object *)&local_30);
  return pcVar1;
}

Assistant:

class_ &def_property_readonly(const char *name, const Getter &fget, const Extra& ...extra) {
        return def_property_readonly(name, cpp_function(method_adaptor<type>(fget)),
                                     return_value_policy::reference_internal, extra...);
    }